

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineCacheTests.cpp
# Opt level: O1

void __thiscall
vkt::pipeline::anon_unknown_0::PipelineFromCacheTestInstance::~PipelineFromCacheTestInstance
          (PipelineFromCacheTestInstance *this)

{
  ~PipelineFromCacheTestInstance(this);
  operator_delete(this,0x598);
  return;
}

Assistant:

PipelineFromCacheTestInstance::~PipelineFromCacheTestInstance (void)
{
	delete[] m_data;
}